

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

opStatus __thiscall
llvm::detail::DoubleAPFloat::multiply(DoubleAPFloat *this,DoubleAPFloat *RHS,roundingMode RM)

{
  Storage *pSVar1;
  byte bVar2;
  APFloat *pAVar3;
  APFloat *pAVar4;
  APFloat *pAVar5;
  opStatus oVar6;
  opStatus oVar7;
  opStatus oVar8;
  opStatus oVar9;
  opStatus oVar10;
  opStatus oVar11;
  opStatus oVar12;
  undefined8 uVar13;
  byte bVar14;
  Storage *pSVar15;
  byte bVar16;
  DoubleAPFloat *RHS_00;
  APFloat U;
  APFloat T;
  APFloat C;
  APFloat Tau;
  APFloat B;
  APFloat A;
  APFloat W;
  APFloat D;
  undefined1 local_130 [8];
  Storage local_128;
  undefined1 local_110 [8];
  Storage local_108;
  undefined1 local_f0 [8];
  IEEEFloat local_e8;
  undefined1 local_d0 [8];
  IEEEFloat local_c8;
  IEEEFloat local_a8;
  IEEEFloat local_88;
  undefined1 local_70 [8];
  IEEEFloat local_68;
  undefined1 local_50 [8];
  IEEEFloat local_48;
  
  pAVar3 = (this->Floats)._M_t.
           super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
           super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
           super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
  pSVar1 = &pAVar3->U;
  pSVar15 = (Storage *)((pAVar3->U).IEEE.significand.part + 8);
  if ((pAVar3->U).semantics != (fltSemantics *)semPPCDoubleDouble) {
    pSVar15 = pSVar1;
  }
  bVar14 = *(undefined1 *)((long)pSVar15 + 0x12) & 7;
  RHS_00 = this;
  if (bVar14 != 1) {
    pAVar4 = (RHS->Floats)._M_t.
             super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
             super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
             super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
    pAVar5 = (APFloat *)(pAVar4->U).IEEE.significand.part;
    if ((pAVar4->U).semantics != (fltSemantics *)semPPCDoubleDouble) {
      pAVar5 = pAVar4;
    }
    bVar2 = *(undefined1 *)((long)&pAVar5->U + 0x12);
    bVar16 = bVar2 & 7;
    RHS_00 = RHS;
    if (bVar16 != 1) {
      if ((*(undefined1 *)((long)pSVar15 + 0x12) & 7) == 0) {
        RHS_00 = this;
        if (bVar16 == 3) {
LAB_00169a9b:
          APFloat::makeNaN(pAVar3,false,false,(APInt *)0x0);
          APFloat::makeZero((this->Floats)._M_t.
                            super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                            .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl + 1,false);
          return opOK;
        }
      }
      else if (bVar14 == 3) {
        RHS_00 = this;
        if (bVar16 == 0) goto LAB_00169a9b;
      }
      else if ((bVar16 != 3) && ((bVar2 & 7) != 0)) {
        if ((bVar14 == 2) && (bVar16 == 2)) {
          if ((pAVar3->U).semantics == (fltSemantics *)semPPCDoubleDouble) {
            DoubleAPFloat((DoubleAPFloat *)&local_88,(DoubleAPFloat *)&pSVar1->IEEE);
          }
          else {
            IEEEFloat::IEEEFloat(&local_88,&pSVar1->IEEE);
          }
          pAVar3 = (this->Floats)._M_t.
                   super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
                   super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                   super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
          pSVar1 = &pAVar3[1].U;
          if (pAVar3[1].U.semantics == (fltSemantics *)semPPCDoubleDouble) {
            DoubleAPFloat((DoubleAPFloat *)&local_a8,(DoubleAPFloat *)&pSVar1->IEEE);
          }
          else {
            IEEEFloat::IEEEFloat(&local_a8,&pSVar1->IEEE);
          }
          pAVar3 = (RHS->Floats)._M_t.
                   super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
                   super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                   super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
          pSVar1 = &pAVar3->U;
          if ((pAVar3->U).semantics == (fltSemantics *)semPPCDoubleDouble) {
            DoubleAPFloat((DoubleAPFloat *)(local_f0 + 8),(DoubleAPFloat *)&pSVar1->IEEE);
          }
          else {
            IEEEFloat::IEEEFloat((IEEEFloat *)(local_f0 + 8),&pSVar1->IEEE);
          }
          pAVar3 = (RHS->Floats)._M_t.
                   super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
                   super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                   super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
          pSVar1 = &pAVar3[1].U;
          if (pAVar3[1].U.semantics == (fltSemantics *)semPPCDoubleDouble) {
            DoubleAPFloat((DoubleAPFloat *)(local_50 + 8),(DoubleAPFloat *)&pSVar1->IEEE);
          }
          else {
            IEEEFloat::IEEEFloat((IEEEFloat *)(local_50 + 8),&pSVar1->IEEE);
          }
          pSVar1 = (Storage *)(local_110 + 8);
          if (local_88.semantics == (fltSemantics *)semPPCDoubleDouble) {
            DoubleAPFloat((DoubleAPFloat *)&pSVar1->IEEE,(DoubleAPFloat *)&local_88);
          }
          else {
            IEEEFloat::IEEEFloat(&pSVar1->IEEE,&local_88);
          }
          oVar6 = APFloat::multiply((APFloat *)local_110,(APFloat *)local_f0,RM);
          uVar13 = local_110;
          if (local_108.semantics == (fltSemantics *)semPPCDoubleDouble) {
            uVar13 = local_108.IEEE.significand;
          }
          if ((*(byte *)(uVar13 + 0x1a) & 6) == 0 || (*(byte *)(uVar13 + 0x1a) & 7) == 3) {
            APFloat::Storage::operator=
                      ((Storage *)
                       &(((this->Floats)._M_t.
                          super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                          .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl)->U).IEEE,
                       pSVar1);
            APFloat::makeZero((this->Floats)._M_t.
                              super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                              .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl + 1,false)
            ;
          }
          else {
            if (local_88.semantics == (fltSemantics *)semPPCDoubleDouble) {
              DoubleAPFloat((DoubleAPFloat *)(local_d0 + 8),(DoubleAPFloat *)&local_88);
            }
            else {
              IEEEFloat::IEEEFloat((IEEEFloat *)(local_d0 + 8),&local_88);
            }
            APFloat::changeSign((APFloat *)local_110);
            oVar7 = APFloat::fusedMultiplyAdd
                              ((APFloat *)local_d0,(APFloat *)local_f0,(APFloat *)local_110,RM);
            APFloat::changeSign((APFloat *)local_110);
            if (local_88.semantics == (fltSemantics *)semPPCDoubleDouble) {
              DoubleAPFloat((DoubleAPFloat *)(local_130 + 8),(DoubleAPFloat *)&local_88);
            }
            else {
              IEEEFloat::IEEEFloat((IEEEFloat *)(local_130 + 8),&local_88);
            }
            oVar8 = APFloat::multiply((APFloat *)local_130,(APFloat *)local_50,RM);
            if (local_a8.semantics == (fltSemantics *)semPPCDoubleDouble) {
              DoubleAPFloat((DoubleAPFloat *)(local_70 + 8),(DoubleAPFloat *)&local_a8);
            }
            else {
              IEEEFloat::IEEEFloat((IEEEFloat *)(local_70 + 8),&local_a8);
            }
            oVar9 = APFloat::multiply((APFloat *)local_70,(APFloat *)local_f0,RM);
            oVar10 = APFloat::add((APFloat *)local_130,(APFloat *)local_70,RM);
            oVar11 = APFloat::add((APFloat *)local_d0,(APFloat *)local_130,RM);
            APFloat::Storage::~Storage((Storage *)(local_70 + 8));
            APFloat::Storage::~Storage((Storage *)(local_130 + 8));
            pSVar1 = (Storage *)(local_130 + 8);
            if (local_108.semantics == (fltSemantics *)semPPCDoubleDouble) {
              DoubleAPFloat((DoubleAPFloat *)&pSVar1->IEEE,(DoubleAPFloat *)(local_110 + 8));
            }
            else {
              IEEEFloat::IEEEFloat(&pSVar1->IEEE,(IEEEFloat *)(local_110 + 8));
            }
            oVar12 = APFloat::add((APFloat *)local_130,(APFloat *)local_d0,RM);
            APFloat::Storage::operator=
                      ((Storage *)
                       &(((this->Floats)._M_t.
                          super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                          .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl)->U).IEEE,
                       pSVar1);
            uVar13 = local_130;
            if (local_128.semantics == (fltSemantics *)semPPCDoubleDouble) {
              uVar13 = local_128.IEEE.significand;
            }
            oVar6 = oVar9 | oVar10 | oVar7 | oVar8 | oVar11 | oVar12 | oVar6;
            if ((*(byte *)(uVar13 + 0x1a) & 6) == 0) {
              APFloat::makeZero((this->Floats)._M_t.
                                super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                                .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl + 1,
                                false);
            }
            else {
              oVar7 = APFloat::subtract((APFloat *)local_110,(APFloat *)local_130,RM);
              oVar8 = APFloat::add((APFloat *)local_110,(APFloat *)local_d0,RM);
              oVar6 = oVar8 | oVar7 | oVar6;
              APFloat::Storage::operator=
                        ((Storage *)
                         &(this->Floats)._M_t.
                          super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                          .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl[1].U.IEEE,
                         (Storage *)(local_110 + 8));
            }
            APFloat::Storage::~Storage((Storage *)(local_130 + 8));
            APFloat::Storage::~Storage((Storage *)(local_d0 + 8));
          }
          APFloat::Storage::~Storage((Storage *)(local_110 + 8));
          APFloat::Storage::~Storage((Storage *)(local_50 + 8));
          APFloat::Storage::~Storage((Storage *)(local_f0 + 8));
          APFloat::Storage::~Storage((Storage *)&local_a8);
          APFloat::Storage::~Storage((Storage *)&local_88);
          return oVar6;
        }
        __assert_fail("LHS.getCategory() == fcNormal && RHS.getCategory() == fcNormal && \"Special cases not handled exhaustively\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                      ,0xffc,
                      "APFloat::opStatus llvm::detail::DoubleAPFloat::multiply(const DoubleAPFloat &, APFloat::roundingMode)"
                     );
      }
    }
  }
  operator=(this,RHS_00);
  return opOK;
}

Assistant:

APFloat::opStatus DoubleAPFloat::multiply(const DoubleAPFloat &RHS,
                                          APFloat::roundingMode RM) {
  const auto &LHS = *this;
  auto &Out = *this;
  /* Interesting observation: For special categories, finding the lowest
     common ancestor of the following layered graph gives the correct
     return category:

        NaN
       /   \
     Zero  Inf
       \   /
       Normal

     e.g. NaN * NaN = NaN
          Zero * Inf = NaN
          Normal * Zero = Zero
          Normal * Inf = Inf
  */
  if (LHS.getCategory() == fcNaN) {
    Out = LHS;
    return opOK;
  }
  if (RHS.getCategory() == fcNaN) {
    Out = RHS;
    return opOK;
  }
  if ((LHS.getCategory() == fcZero && RHS.getCategory() == fcInfinity) ||
      (LHS.getCategory() == fcInfinity && RHS.getCategory() == fcZero)) {
    Out.makeNaN(false, false, nullptr);
    return opOK;
  }
  if (LHS.getCategory() == fcZero || LHS.getCategory() == fcInfinity) {
    Out = LHS;
    return opOK;
  }
  if (RHS.getCategory() == fcZero || RHS.getCategory() == fcInfinity) {
    Out = RHS;
    return opOK;
  }
  assert(LHS.getCategory() == fcNormal && RHS.getCategory() == fcNormal &&
         "Special cases not handled exhaustively");

  int Status = opOK;
  APFloat A = Floats[0], B = Floats[1], C = RHS.Floats[0], D = RHS.Floats[1];
  // t = a * c
  APFloat T = A;
  Status |= T.multiply(C, RM);
  if (!T.isFiniteNonZero()) {
    Floats[0] = T;
    Floats[1].makeZero(/* Neg = */ false);
    return (opStatus)Status;
  }

  // tau = fmsub(a, c, t), that is -fmadd(-a, c, t).
  APFloat Tau = A;
  T.changeSign();
  Status |= Tau.fusedMultiplyAdd(C, T, RM);
  T.changeSign();
  {
    // v = a * d
    APFloat V = A;
    Status |= V.multiply(D, RM);
    // w = b * c
    APFloat W = B;
    Status |= W.multiply(C, RM);
    Status |= V.add(W, RM);
    // tau += v + w
    Status |= Tau.add(V, RM);
  }
  // u = t + tau
  APFloat U = T;
  Status |= U.add(Tau, RM);

  Floats[0] = U;
  if (!U.isFinite()) {
    Floats[1].makeZero(/* Neg = */ false);
  } else {
    // Floats[1] = (t - u) + tau
    Status |= T.subtract(U, RM);
    Status |= T.add(Tau, RM);
    Floats[1] = T;
  }
  return (opStatus)Status;
}